

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O3

void vkt::Draw::createDrawTests(TestCaseGroup *testGroup)

{
  TestContext *testCtx;
  long *description;
  long *name;
  TestNode *node;
  int *piVar1;
  int iVar2;
  allocator<char> local_79;
  TestNode *local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  iVar2 = 0;
  piVar1 = &DAT_00b089dc;
  local_78 = &testGroup->super_TestNode;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,(char *)((long)&DAT_00b089dc + (long)*piVar1),&local_79);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Group for testing a specific draw command.","");
    name = local_50[0];
    description = local_70[0];
    testCtx = local_78->m_testCtx;
    node = (TestNode *)operator_new(0x80);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,testCtx,(char *)name,(char *)description);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cfd190;
    node[1]._vptr_TestNode = (_func_int **)createTopologyGroups;
    *(int *)&node[1].m_testCtx = iVar2;
    tcu::TestNode::addChild(local_78,node);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    iVar2 = iVar2 + 1;
    piVar1 = piVar1 + 1;
  } while (iVar2 != 4);
  return;
}

Assistant:

void createDrawTests (tcu::TestCaseGroup* testGroup)
{
	for (deUint32 idx = 0; idx < DRAW_COMMAND_TYPE_DRAW_LAST; ++idx)
	{
		const DrawCommandType	command	= DrawCommandType(idx);
		addTestGroup(testGroup, getDrawCommandTypeName(command), "Group for testing a specific draw command.", createTopologyGroups, command);
	}
}